

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# api_test.c
# Opt level: O1

int main(void)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  int iVar8;
  uint uVar9;
  char *__s;
  undefined1 auVar10 [32];
  unsigned_long_long mlen;
  unsigned_long_long smlen;
  uchar message [50];
  uchar omessage [50];
  uchar pk [35];
  uchar sk [52];
  uchar sm [14662];
  unsigned_long_long local_3a58;
  unsigned_long_long local_3a50;
  undefined8 local_3a48;
  undefined8 uStack_3a40;
  undefined2 uStack_3a38;
  undefined6 uStack_3a36;
  undefined2 uStack_3a30;
  undefined6 uStack_3a2e;
  undefined2 uStack_3a28;
  undefined8 uStack_3a26;
  undefined8 uStack_3a1e;
  undefined8 local_3a08;
  undefined8 uStack_3a00;
  undefined2 uStack_39f8;
  undefined6 uStack_39f6;
  undefined2 uStack_39f0;
  undefined6 uStack_39ee;
  undefined2 uStack_39e8;
  undefined8 uStack_39e6;
  undefined8 uStack_39de;
  uchar local_39c8 [48];
  uchar local_3998 [64];
  undefined8 local_3958;
  undefined8 uStack_3950;
  undefined2 uStack_3948;
  undefined6 uStack_3946;
  undefined2 uStack_3940;
  undefined6 uStack_393e;
  undefined2 uStack_3938;
  undefined8 uStack_3936;
  undefined8 uStack_392e;
  
  local_39c8[0] = '\0';
  local_39c8[1] = '\0';
  local_39c8[2] = '\0';
  local_39c8[3] = '\0';
  local_39c8[4] = '\0';
  local_39c8[5] = '\0';
  local_39c8[6] = '\0';
  local_39c8[7] = '\0';
  local_39c8[8] = '\0';
  local_39c8[9] = '\0';
  local_39c8[10] = '\0';
  local_39c8[0xb] = '\0';
  local_39c8[0xc] = '\0';
  local_39c8[0xd] = '\0';
  local_39c8[0xe] = '\0';
  local_39c8[0xf] = '\0';
  local_39c8[0x10] = '\0';
  local_39c8[0x11] = '\0';
  local_39c8[0x12] = '\0';
  local_39c8[0x13] = '\0';
  local_39c8[0x14] = '\0';
  local_39c8[0x15] = '\0';
  local_39c8[0x16] = '\0';
  local_39c8[0x17] = '\0';
  local_39c8[0x18] = '\0';
  local_39c8[0x19] = '\0';
  local_39c8[0x1a] = '\0';
  local_39c8[0x1b] = '\0';
  local_39c8[0x1c] = '\0';
  local_39c8[0x1d] = '\0';
  local_39c8[0x1e] = '\0';
  local_39c8[0x1f] = '\0';
  local_39c8[0x20] = '\0';
  local_39c8[0x21] = '\0';
  local_39c8[0x22] = '\0';
  local_3998[0x20] = '\0';
  local_3998[0x21] = '\0';
  local_3998[0x22] = '\0';
  local_3998[0x23] = '\0';
  local_3998[0x24] = '\0';
  local_3998[0x25] = '\0';
  local_3998[0x26] = '\0';
  local_3998[0x27] = '\0';
  local_3998[0x28] = '\0';
  local_3998[0x29] = '\0';
  local_3998[0x2a] = '\0';
  local_3998[0x2b] = '\0';
  local_3998[0x2c] = '\0';
  local_3998[0x2d] = '\0';
  local_3998[0x2e] = '\0';
  local_3998[0x2f] = '\0';
  local_3998[0x30] = '\0';
  local_3998[0x31] = '\0';
  local_3998[0x32] = '\0';
  local_3998[0x33] = '\0';
  local_3998[0] = '\0';
  local_3998[1] = '\0';
  local_3998[2] = '\0';
  local_3998[3] = '\0';
  local_3998[4] = '\0';
  local_3998[5] = '\0';
  local_3998[6] = '\0';
  local_3998[7] = '\0';
  local_3998[8] = '\0';
  local_3998[9] = '\0';
  local_3998[10] = '\0';
  local_3998[0xb] = '\0';
  local_3998[0xc] = '\0';
  local_3998[0xd] = '\0';
  local_3998[0xe] = '\0';
  local_3998[0xf] = '\0';
  local_3998[0x10] = '\0';
  local_3998[0x11] = '\0';
  local_3998[0x12] = '\0';
  local_3998[0x13] = '\0';
  local_3998[0x14] = '\0';
  local_3998[0x15] = '\0';
  local_3998[0x16] = '\0';
  local_3998[0x17] = '\0';
  local_3998[0x18] = '\0';
  local_3998[0x19] = '\0';
  local_3998[0x1a] = '\0';
  local_3998[0x1b] = '\0';
  local_3998[0x1c] = '\0';
  local_3998[0x1d] = '\0';
  local_3998[0x1e] = '\0';
  local_3998[0x1f] = '\0';
  uStack_3a28 = 0;
  uStack_3a26 = 0;
  uStack_3a1e = 0;
  local_3a48 = 0;
  uStack_3a40 = 0;
  uStack_3a38 = 0;
  uStack_3a36 = 0;
  uStack_3a30 = 0;
  uStack_3a2e = 0;
  uStack_39e8 = 0;
  uStack_39e6 = 0;
  uStack_39de = 0;
  local_3a08 = 0;
  uStack_3a00 = 0;
  uStack_39f8 = 0;
  uStack_39f6 = 0;
  uStack_39f0 = 0;
  uStack_39ee = 0;
  memset(&local_3958,0,0x3946);
  iVar8 = crypto_sign_keypair(local_39c8,local_3998);
  if (iVar8 != 0) {
    __s = "Failed to generate key pair";
    goto LAB_0010129d;
  }
  local_3a50 = 0x3946;
  iVar8 = crypto_sign((uchar *)&local_3958,&local_3a50,(uchar *)&local_3a48,0x32,local_3998);
  if (iVar8 == 0) {
    local_3a58 = 0x32;
    uVar9 = crypto_sign_open((uchar *)&local_3a08,&local_3a58,(uchar *)&local_3958,local_3a50,
                             local_39c8);
    if (uVar9 != 0) {
LAB_001012e2:
      printf("Failed to verify (ret = %d)\n",(ulong)uVar9);
      return -1;
    }
    if (local_3a58 != 0x32) {
LAB_001013f3:
      printf("length of message after verify incorrect, got %llu, expected %zu\n",local_3a58,0x32);
      return -1;
    }
    auVar10._8_8_ = uStack_3a40;
    auVar10._0_8_ = local_3a48;
    auVar10._16_2_ = uStack_3a38;
    auVar10._18_6_ = uStack_3a36;
    auVar10._24_2_ = uStack_3a30;
    auVar10._26_6_ = uStack_3a2e;
    auVar2._6_2_ = uStack_3a30;
    auVar2._0_6_ = uStack_3a36;
    auVar2._8_6_ = uStack_3a2e;
    auVar2._14_2_ = uStack_3a28;
    auVar2._16_8_ = uStack_3a26;
    auVar2._24_8_ = uStack_3a1e;
    auVar4._8_8_ = uStack_3a00;
    auVar4._0_8_ = local_3a08;
    auVar4._16_2_ = uStack_39f8;
    auVar4._18_6_ = uStack_39f6;
    auVar4._24_2_ = uStack_39f0;
    auVar4._26_6_ = uStack_39ee;
    auVar5._6_2_ = uStack_39f0;
    auVar5._0_6_ = uStack_39f6;
    auVar5._8_6_ = uStack_39ee;
    auVar5._14_2_ = uStack_39e8;
    auVar5._16_8_ = uStack_39e6;
    auVar5._24_8_ = uStack_39de;
    auVar10 = vpternlogq_avx512vl(auVar10 ^ auVar4,auVar2,auVar5,0xf6);
    if (auVar10 == (undefined1  [32])0x0) {
      uStack_3938 = uStack_3a28;
      uStack_3936 = uStack_3a26;
      uStack_392e = uStack_3a1e;
      local_3958 = local_3a48;
      uStack_3950 = uStack_3a40;
      uStack_3948 = uStack_3a38;
      uStack_3946 = uStack_3a36;
      uStack_3940 = uStack_3a30;
      uStack_393e = uStack_3a2e;
      local_3a50 = 0x3946;
      iVar8 = crypto_sign((uchar *)&local_3958,&local_3a50,(uchar *)&local_3958,0x32,local_3998);
      if (iVar8 != 0) goto LAB_00101296;
      local_3a58 = local_3a50;
      uVar9 = crypto_sign_open((uchar *)&local_3958,&local_3a58,(uchar *)&local_3958,local_3a50,
                               local_39c8);
      if (uVar9 != 0) goto LAB_001012e2;
      if (local_3a58 != 0x32) goto LAB_001013f3;
      auVar1._8_8_ = uStack_3a40;
      auVar1._0_8_ = local_3a48;
      auVar1._16_2_ = uStack_3a38;
      auVar1._18_6_ = uStack_3a36;
      auVar1._24_2_ = uStack_3a30;
      auVar1._26_6_ = uStack_3a2e;
      auVar3._6_2_ = uStack_3a30;
      auVar3._0_6_ = uStack_3a36;
      auVar3._8_6_ = uStack_3a2e;
      auVar3._14_2_ = uStack_3a28;
      auVar3._16_8_ = uStack_3a26;
      auVar3._24_8_ = uStack_3a1e;
      auVar6._8_8_ = uStack_3950;
      auVar6._0_8_ = local_3958;
      auVar6._16_2_ = uStack_3948;
      auVar6._18_6_ = uStack_3946;
      auVar6._24_2_ = uStack_3940;
      auVar6._26_6_ = uStack_393e;
      auVar7._6_2_ = uStack_3940;
      auVar7._0_6_ = uStack_3946;
      auVar7._8_6_ = uStack_393e;
      auVar7._14_2_ = uStack_3938;
      auVar7._16_8_ = uStack_3936;
      auVar7._24_8_ = uStack_392e;
      auVar10 = vpternlogq_avx512vl(auVar1 ^ auVar6,auVar3,auVar7,0xf6);
      if (auVar10 == (undefined1  [32])0x0) {
        puts("Sign/Verify test passed");
        return 0;
      }
    }
    __s = "message mismatch after verification";
  }
  else {
LAB_00101296:
    __s = "Failed to sign";
  }
LAB_0010129d:
  puts(__s);
  return -1;
}

Assistant:

int main(void) {
  unsigned char pk[CRYPTO_PUBLICKEYBYTES]          = {0};
  unsigned char sk[CRYPTO_SECRETKEYBYTES]          = {0};
  const unsigned char message[50]                  = {0};
  unsigned char omessage[sizeof(message)]          = {0};
  unsigned char sm[sizeof(message) + CRYPTO_BYTES] = {0};

  int ret = crypto_sign_keypair(pk, sk);
  VALGRIND_MAKE_MEM_DEFINED(&ret, sizeof(ret));
  if (ret != 0) {
    printf("Failed to generate key pair\n");
    return -1;
  }

  VALGRIND_MAKE_MEM_UNDEFINED(sk, sizeof(sk));
  VALGRIND_MAKE_MEM_UNDEFINED(message, sizeof(message));

  unsigned long long smlen = sizeof(sm);
  ret                      = crypto_sign(sm, &smlen, message, sizeof(message), sk);
  if (ret != 0) {
    printf("Failed to sign\n");
    return -1;
  }

  VALGRIND_MAKE_MEM_DEFINED(sm, smlen);
  VALGRIND_MAKE_MEM_DEFINED(sk, sizeof(sk));
  VALGRIND_MAKE_MEM_DEFINED(message, sizeof(message));

  unsigned long long mlen = sizeof(omessage);
  ret                     = crypto_sign_open(omessage, &mlen, sm, smlen, pk);
  if (ret != 0) {
    printf("Failed to verify (ret = %d)\n", ret);
    return -1;
  }

  if (mlen != sizeof(message)) {
    printf("length of message after verify incorrect, got " LL_FMT ", expected " SIZET_FMT "\n",
           mlen, sizeof(message));
    return -1;
  }
  if (memcmp(message, omessage, sizeof(message)) != 0) {
    printf("message mismatch after verification\n");
    return -1;
  }

  // test special case where message and signature overlap
  memcpy(sm, message, sizeof(message));

  smlen = sizeof(sm);
  ret   = crypto_sign(sm, &smlen, sm, sizeof(message), sk);
  if (ret != 0) {
    printf("Failed to sign\n");
    return -1;
  }

  mlen = smlen;
  ret  = crypto_sign_open(sm, &mlen, sm, smlen, pk);
  if (ret != 0) {
    printf("Failed to verify (ret = %d)\n", ret);
    return -1;
  }

  if (mlen != sizeof(message)) {
    printf("length of message after verify incorrect, got " LL_FMT ", expected " SIZET_FMT "\n",
           mlen, sizeof(message));
    return -1;
  }
  if (memcmp(message, sm, sizeof(message)) != 0) {
    printf("message mismatch after verification\n");
    return -1;
  }

  printf("Sign/Verify test passed\n");

  return 0;
}